

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUtil.hpp
# Opt level: O0

char * vkt::tessellation::getWindingShaderName(Winding winding)

{
  char *pcStack_10;
  Winding winding_local;
  
  if (winding == WINDING_CCW) {
    pcStack_10 = "ccw";
  }
  else if (winding == WINDING_CW) {
    pcStack_10 = "cw";
  }
  else {
    pcStack_10 = (char *)0x0;
  }
  return pcStack_10;
}

Assistant:

static inline const char* getWindingShaderName (const Winding winding)
{
	switch (winding)
	{
		case WINDING_CCW:	return "ccw";
		case WINDING_CW:	return "cw";
		default:
			DE_ASSERT(false);
			return DE_NULL;
	}
}